

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSeparateShaderTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_0::SeparateShaderTest::testActiveProgramUniform
          (SeparateShaderTest *this,
          MovePtr<deqp::gles31::Functional::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline>_>
          *pipeOut)

{
  PtrData<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
  data;
  PtrData<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
  data_00;
  byte bVar1;
  deUint32 pipeline_00;
  deBool dVar2;
  ProgramWrapper *pPVar3;
  TestLog *this_00;
  MessageBuilder *pMVar4;
  RenderContext *renderCtx;
  TestLog *this_01;
  TestLog *this_02;
  TestLog *this_03;
  TestLog *log;
  SeparateShaderTest *pSVar5;
  double __x;
  double __x_00;
  double __x_01;
  double __x_02;
  ProgramParams PVar6;
  undefined8 in_stack_fffffffffffff7e8;
  ResultCollector *this_04;
  undefined7 in_stack_fffffffffffff7f0;
  undefined1 in_stack_fffffffffffff7f7;
  allocator<char> local_729;
  string local_728;
  undefined1 local_701;
  undefined1 local_700 [7];
  bool result;
  MessageBuilder local_580;
  MessageBuilder local_400;
  GLint local_280;
  GLint local_27c;
  GLint frgLoc;
  GLint vtxLoc;
  ProgramPipeline pipeline;
  undefined1 local_260 [4];
  GLuint changeName;
  PtrData<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
  *local_250;
  undefined1 local_240 [8];
  UniquePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
  changeProg;
  ProgramParams changePp;
  GLuint local_9c;
  undefined1 local_98 [4];
  GLuint refProgName;
  PtrData<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
  *local_88;
  undefined1 local_78 [8];
  UniquePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
  refProg;
  deUint32 drawSeed;
  undefined1 local_58 [8];
  Surface resultSurface;
  Surface refSurface;
  ProgramParams refPp;
  MovePtr<deqp::gles31::Functional::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline>_>
  *pipeOut_local;
  SeparateShaderTest *this_local;
  
  refPp._8_8_ = pipeOut;
  join_0x00000010_0x00000000_ = genProgramParams(&this->m_rnd);
  tcu::Surface::Surface((Surface *)&resultSurface.m_pixels.m_cap);
  tcu::Surface::Surface((Surface *)local_58);
  refProg.
  super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
  .m_data._8_4_ = de::Random::getUint32(&this->m_rnd);
  pSVar5 = this;
  createReferenceProgram
            ((MovePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
              *)local_98,this,(ProgramParams *)&refSurface.m_pixels.m_cap);
  local_88 = de::details::MovePtr::operator_cast_to_PtrData
                       ((PtrData<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
                         *)local_98,(MovePtr *)pSVar5);
  data._8_7_ = in_stack_fffffffffffff7f0;
  data.ptr = (ProgramWrapper *)in_stack_fffffffffffff7e8;
  data._15_1_ = in_stack_fffffffffffff7f7;
  de::details::
  UniquePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
  ::UniquePtr((UniquePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
               *)local_78,data);
  de::details::
  MovePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
  ::~MovePtr((MovePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
              *)local_98);
  pPVar3 = de::details::
           UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
           ::operator->((UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
                         *)local_78);
  local_9c = (*pPVar3->_vptr_ProgramWrapper[2])();
  glu::CallLogWrapper::glUseProgram(&this->super_CallLogWrapper,local_9c);
  SeparateShaderTest::log(this,__x);
  tcu::TestLog::operator<<
            ((MessageBuilder *)&changePp.frgSeed,this_00,(BeginMessageToken *)&tcu::TestLog::Message
            );
  pMVar4 = tcu::MessageBuilder::operator<<
                     ((MessageBuilder *)&changePp.frgSeed,(char (*) [26])"// Use reference program "
                     );
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_9c);
  tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&changePp.frgSeed);
  drawSurface(this,(Surface *)&resultSurface.m_pixels.m_cap,
              refProg.
              super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
              .m_data._8_4_);
  glu::CallLogWrapper::glUseProgram(&this->super_CallLogWrapper,0);
  de::details::
  UniquePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
  ::~UniquePtr((UniquePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
                *)local_78);
  PVar6 = genProgramParams(&this->m_rnd);
  changeProg.
  super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
  .m_data._12_4_ = PVar6.vtxScale;
  changeProg.
  super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
  .m_data._8_4_ = (deUint32)refSurface.m_pixels.m_cap;
  changePp.vtxScale = PVar6.frgScale;
  changePp.vtxSeed = refPp.vtxSeed;
  pSVar5 = this;
  createReferenceProgram
            ((MovePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
              *)local_260,this,
             (ProgramParams *)
             &changeProg.
              super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
              .m_data.field_0x8);
  local_250 = de::details::MovePtr::operator_cast_to_PtrData
                        ((PtrData<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
                          *)local_260,(MovePtr *)pSVar5);
  data_00._8_7_ = in_stack_fffffffffffff7f0;
  data_00.ptr = (ProgramWrapper *)in_stack_fffffffffffff7e8;
  data_00._15_1_ = in_stack_fffffffffffff7f7;
  de::details::
  UniquePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
  ::UniquePtr((UniquePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
               *)local_240,data_00);
  de::details::
  MovePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
  ::~MovePtr((MovePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
              *)local_260);
  pPVar3 = de::details::
           UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
           ::operator->((UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
                         *)local_240);
  pipeline._12_4_ = (*pPVar3->_vptr_ProgramWrapper[2])();
  renderCtx = getRenderContext(this);
  glu::ProgramPipeline::ProgramPipeline((ProgramPipeline *)&frgLoc,renderCtx);
  local_27c = glu::CallLogWrapper::glGetUniformLocation
                        (&this->super_CallLogWrapper,pipeline._12_4_,"vtxScale");
  local_280 = glu::CallLogWrapper::glGetUniformLocation
                        (&this->super_CallLogWrapper,pipeline._12_4_,"frgScale");
  do {
    glu::CallLogWrapper::enableLogging(&this->super_CallLogWrapper,true);
    pipeline_00 = glu::ProgramPipeline::getPipeline((ProgramPipeline *)&frgLoc);
    glu::CallLogWrapper::glBindProgramPipeline(&this->super_CallLogWrapper,pipeline_00);
    glu::CallLogWrapper::enableLogging(&this->super_CallLogWrapper,false);
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  glu::ProgramPipeline::activeShaderProgram((ProgramPipeline *)&frgLoc,pipeline._12_4_);
  SeparateShaderTest::log(this,__x_00);
  tcu::TestLog::operator<<(&local_400,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar4 = tcu::MessageBuilder::operator<<
                     (&local_400,(char (*) [33])"// Set active shader program to ");
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(uint *)&pipeline.field_0xc);
  tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_400);
  glu::CallLogWrapper::glUniform1f
            (&this->super_CallLogWrapper,local_27c,refSurface.m_pixels.m_cap._4_4_);
  SeparateShaderTest::log(this,__x_01);
  tcu::TestLog::operator<<(&local_580,this_02,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar4 = tcu::MessageBuilder::operator<<
                     (&local_580,(char (*) [30])"// Set uniform \'vtxScale\' to ");
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(float *)((long)&refSurface.m_pixels.m_cap + 4));
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [19])" using glUniform1f");
  tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_580);
  glu::CallLogWrapper::glUniform1f(&this->super_CallLogWrapper,local_280,refPp.vtxScale);
  SeparateShaderTest::log(this,__x_02);
  tcu::TestLog::operator<<
            ((MessageBuilder *)local_700,this_03,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar4 = tcu::MessageBuilder::operator<<
                     ((MessageBuilder *)local_700,(char (*) [30])"// Set uniform \'frgScale\' to ");
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&refPp.vtxScale);
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [19])" using glUniform1f");
  tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_700);
  glu::ProgramPipeline::activeShaderProgram((ProgramPipeline *)&frgLoc,0);
  do {
    glu::CallLogWrapper::enableLogging(&this->super_CallLogWrapper,true);
    glu::CallLogWrapper::glBindProgramPipeline(&this->super_CallLogWrapper,0);
    glu::CallLogWrapper::enableLogging(&this->super_CallLogWrapper,false);
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  do {
    glu::CallLogWrapper::enableLogging(&this->super_CallLogWrapper,true);
    glu::CallLogWrapper::glUseProgram(&this->super_CallLogWrapper,pipeline._12_4_);
    glu::CallLogWrapper::enableLogging(&this->super_CallLogWrapper,false);
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  drawSurface(this,(Surface *)local_58,
              refProg.
              super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
              .m_data._8_4_);
  do {
    glu::CallLogWrapper::enableLogging(&this->super_CallLogWrapper,true);
    glu::CallLogWrapper::glUseProgram(&this->super_CallLogWrapper,0);
    glu::CallLogWrapper::enableLogging(&this->super_CallLogWrapper,false);
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  glu::ProgramPipeline::~ProgramPipeline((ProgramPipeline *)&frgLoc);
  de::details::
  UniquePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
  ::~UniquePtr((UniquePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
                *)local_240);
  log = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  bVar1 = tcu::fuzzyCompare(log,"Active program uniform result","Active program uniform result",
                            (Surface *)&resultSurface.m_pixels.m_cap,(Surface *)local_58,0.05,
                            COMPARE_LOG_RESULT);
  this_04 = &this->m_status;
  local_701 = bVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_728,
             "glUniform() did not correctly modify the active program of the bound pipeline",
             &local_729);
  tcu::ResultCollector::check(this_04,(bool)(bVar1 & 1),&local_728);
  std::__cxx11::string::~string((string *)&local_728);
  std::allocator<char>::~allocator(&local_729);
  tcu::Surface::~Surface((Surface *)local_58);
  tcu::Surface::~Surface((Surface *)&resultSurface.m_pixels.m_cap);
  return;
}

Assistant:

void SeparateShaderTest::testActiveProgramUniform (MovePtr<Pipeline>& pipeOut)
{
	ProgramParams				refPp			= genProgramParams(m_rnd);
	Surface						refSurface;
	Surface						resultSurface;
	deUint32					drawSeed		= m_rnd.getUint32();

	DE_UNREF(pipeOut);
	{
		UniquePtr<ProgramWrapper>	refProg		(createReferenceProgram(refPp));
		GLuint						refProgName	= refProg->getProgramName();

		glUseProgram(refProgName);
		log() << TestLog::Message << "// Use reference program " << refProgName
			  << TestLog::EndMessage;
		drawSurface(refSurface, drawSeed);
		glUseProgram(0);
	}

	{
		ProgramParams				changePp	= genProgramParams(m_rnd);
		changePp.vtxSeed						= refPp.vtxSeed;
		changePp.frgSeed						= refPp.frgSeed;
		UniquePtr<ProgramWrapper>	changeProg	(createReferenceProgram(changePp));
		GLuint						changeName	= changeProg->getProgramName();
		ProgramPipeline				pipeline	(getRenderContext());
		GLint						vtxLoc		= glGetUniformLocation(changeName, "vtxScale");
		GLint						frgLoc		= glGetUniformLocation(changeName, "frgScale");

		LOG_CALL(glBindProgramPipeline(pipeline.getPipeline()));

		pipeline.activeShaderProgram(changeName);
		log() << TestLog::Message << "// Set active shader program to " << changeName
			  << TestLog::EndMessage;

		glUniform1f(vtxLoc, refPp.vtxScale);
		log() << TestLog::Message
			  << "// Set uniform 'vtxScale' to " << refPp.vtxScale << " using glUniform1f"
			  << TestLog::EndMessage;
		glUniform1f(frgLoc, refPp.frgScale);
		log() << TestLog::Message
			  << "// Set uniform 'frgScale' to " << refPp.frgScale << " using glUniform1f"
			  << TestLog::EndMessage;

		pipeline.activeShaderProgram(0);
		LOG_CALL(glBindProgramPipeline(0));

		LOG_CALL(glUseProgram(changeName));
		drawSurface(resultSurface, drawSeed);
		LOG_CALL(glUseProgram(0));
	}

	bool result = tcu::fuzzyCompare(
		m_testCtx.getLog(), "Active program uniform result",
		"Active program uniform result",
		refSurface, resultSurface, 0.05f, tcu::COMPARE_LOG_RESULT);

	m_status.check(result,
				   "glUniform() did not correctly modify "
				   "the active program of the bound pipeline");
}